

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O2

void __thiscall CFriends::Init(CFriends *this)

{
  IKernel *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  
  pIVar1 = (this->super_IFriends).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x38))(plVar3,ConfigSaveCallback,this);
  }
  pIVar1 = (this->super_IFriends).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"console");
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x40))
              (plVar3,"add_friend","s[name] s[clan]",2,ConAddFriend,this,"Add a friend");
    (**(code **)(*plVar3 + 0x40))
              (plVar3,"remove_friend","s[name] s[clan]",2,ConRemoveFriend,this,"Remove a friend");
  }
  return;
}

Assistant:

void CFriends::Init()
{
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	IConsole *pConsole = Kernel()->RequestInterface<IConsole>();
	if(pConsole)
	{
		pConsole->Register("add_friend", "s[name] s[clan]", CFGFLAG_CLIENT, ConAddFriend, this, "Add a friend");
		pConsole->Register("remove_friend", "s[name] s[clan]", CFGFLAG_CLIENT, ConRemoveFriend, this, "Remove a friend");
	}
}